

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenCallSetTarget(BinaryenExpressionRef expr,char *target)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id != CallId) {
    __assert_fail("expression->is<Call>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x8b7,"void BinaryenCallSetTarget(BinaryenExpressionRef, const char *)");
  }
  if (target != (char *)0x0) {
    this = (IString *)strlen(target);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)target;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 3) = sVar1;
    return;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x8b8,"void BinaryenCallSetTarget(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenCallSetTarget(BinaryenExpressionRef expr, const char* target) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Call>());
  assert(target);
  static_cast<Call*>(expression)->target = target;
}